

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

string * __thiscall
pbrt::RealisticCamera::LensElementInterface::ToString_abi_cxx11_(LensElementInterface *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             &this->curvatureRadius);
  return in_RDI;
}

Assistant:

std::string RealisticCamera::LensElementInterface::ToString() const {
    return StringPrintf("[ LensElementInterface curvatureRadius: %f thickness: %f "
                        "eta: %f apertureRadius: %f ]",
                        curvatureRadius, thickness, eta, apertureRadius);
}